

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack11_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7ff;
  out[1] = *in >> 0xb & 0x7ff;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x16;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 1) << 10 | *puVar1;
  out[3] = *puVar2 >> 1 & 0x7ff;
  out[4] = *puVar2 >> 0xc & 0x7ff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x17;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 3) << 9 | *puVar1;
  out[6] = *puVar2 >> 2 & 0x7ff;
  out[7] = *puVar2 >> 0xd & 0x7ff;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack11_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 11);
  out++;
  *out = ((*in) >> 11) % (1U << 11);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 1)) << (11 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 11);
  out++;
  *out = ((*in) >> 12) % (1U << 11);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 2)) << (11 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 11);
  out++;
  *out = ((*in) >> 13) % (1U << 11);
  out++;

  return in + 1;
}